

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>
           *this)

{
  CDEFBlockTest *this_00;
  
  WithParamInterface<std::tuple<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,BLOCK_SIZE,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (CDEFBlockTest *)operator_new(0x68);
  anon_unknown.dwarf_2686dc::CDEFBlockTest::CDEFBlockTest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00ee6280;
  (this_00->
  super_TestWithParam<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>_>
  ).
  super_WithParamInterface<std::tuple<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_BLOCK_SIZE,_int,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test_00ee62c0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }